

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O2

error_t ArgumentHandlers::modelOptions_parse_argument(int key,char *arg,argp_state *state)

{
  void *pvVar1;
  float fVar2;
  
  pvVar1 = state->input;
  if (key == 1) {
    *(undefined4 *)((long)pvVar1 + 0x6c) = 1;
  }
  else if (key == 0x73) {
    *(undefined4 *)((long)pvVar1 + 0x68) = 1;
  }
  else {
    if (key == 0x67) {
      fVar2 = strtof(arg,(char **)0x0);
      *(double *)((long)pvVar1 + 0x70) = (double)fVar2;
      return 0;
    }
    if (key != 0x66) {
      return 7;
    }
    *(undefined1 *)((long)pvVar1 + 0x65) = 1;
  }
  return 0;
}

Assistant:

error_t
modelOptions_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;

    switch (key)
    {
        case 'f': 
            theArgumentsStruc->cache_flat_models = true;
            break;
        case 's': 
            theArgumentsStruc->sparse = 1;
            break;
        case OPT_TOI:
            theArgumentsStruc->isTOI=1;
            break;
        case 'g':
            theArgumentsStruc->discount = strtof(arg,0);
            break;
        default:
            return ARGP_ERR_UNKNOWN;
     }
    return 0;
}